

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall Diligent::GLContextState::EnableDepthWrites(GLContextState *this,bool bEnable)

{
  ENABLE_STATE EVar1;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  uint local_4c;
  string local_48;
  
  EVar1 = DISABLED - (int)CONCAT71(in_register_00000031,bEnable);
  if ((this->m_DSState).m_DepthWritesEnableState.m_EnableState != EVar1) {
    glDepthMask();
    local_4c = glGetError();
    if (local_4c != 0) {
      LogError<false,char[38],char[17],unsigned_int>
                (false,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb,(char (*) [38])"Failed to enable/disable depth writes",
                 (char (*) [17])"\nGL Error Code: ",&local_4c);
      FormatString<char[6]>(&local_48,(char (*) [6])0x861532);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    (this->m_DSState).m_DepthWritesEnableState.m_EnableState = EVar1;
  }
  return;
}

Assistant:

void GLContextState::EnableDepthWrites(bool bEnable)
{
    if (m_DSState.m_DepthWritesEnableState != bEnable)
    {
        // If mask is non-zero, the depth buffer is enabled for writing; otherwise, it is disabled.
        glDepthMask(bEnable ? 1 : 0);
        DEV_CHECK_GL_ERROR("Failed to enable/disable depth writes");
        m_DSState.m_DepthWritesEnableState = bEnable;
    }
}